

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_file(Ptr *image,string *filename)

{
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<unsigned_char>,void>
            (local_28,&image->
                       super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  save_file((ConstPtr *)local_28,filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void
save_file (ByteImage::Ptr image, std::string const& filename)
{
    save_file(ByteImage::ConstPtr(image), filename);
}